

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

int __thiscall pstore::file::file_handle::truncate(file_handle *this,char *__file,__off_t __length)

{
  int iVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  ensure_open(this);
  if ((long)__file < 0) {
    raise<std::errc,char[9]>(invalid_argument,(char (*) [9])"truncate");
  }
  iVar1 = ftruncate(this->file_,(__off_t)__file);
  if (iVar1 != -1) {
    return iVar1;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  std::__cxx11::string::string((string *)&bStack_38,(string *)&this->path_);
  (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
            (iVar1,"ftruncate failed",&bStack_38);
}

Assistant:

void file_handle::truncate (std::uint64_t const size) {
            this->ensure_open ();
            if (size > uoff_max) {
                raise (std::errc::invalid_argument, "truncate");
            }
            if (::ftruncate (file_, static_cast<off_t> (size)) == -1) {
                int const err = errno;
                raise_file_error (err, "ftruncate failed", this->path ());
            }
        }